

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmCpGen<(moira::Instr)149,(moira::Mode)12,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 v;
  StrWriter *pSVar1;
  Av<(moira::Instr)149,_(moira::Mode)12,_0> local_38;
  u32 local_34;
  int local_30;
  Imu<4> local_28;
  byte local_23;
  u16 local_22;
  Imu<4> ext;
  u8 id;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_22 = op;
  _ext = addr;
  if ((str->style->syntax == GNU) || (str->style->syntax == GNU_MIT)) {
    dasmIllegal<(moira::Instr)149,(moira::Mode)12,0>(this,str,addr,op);
  }
  else {
    local_23 = (byte)((int)(uint)op >> 9) & 7;
    v = dasmIncRead<4>(this,addr);
    Imu<4>::Imu(&local_28,v);
    pSVar1 = StrWriter::operator<<(str,(uint)local_23);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_30 = (str->tab).raw;
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_30);
    local_34 = local_28.raw;
    StrWriter::operator<<(pSVar1,local_28);
    local_38.ext1 = 0;
    StrWriter::operator<<(str,&local_38);
  }
  return;
}

Assistant:

void
Moira::dasmCpGen(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto id  = ( ____xxx_________(op) );
    auto ext = Imu ( dasmIncRead<Long>(addr) );

    str << id << Ins<I>{} << str.tab << ext;
    str << Av<I, M, S>{};
}